

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

void __thiscall TextBuffer::set_text_in_range(TextBuffer *this,Range old_range,u16string *string)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  uint32_t *puVar2;
  Layer *pLVar3;
  undefined1 auVar4 [12];
  undefined8 old_splice_start;
  bool bVar5;
  uint32_t uVar6;
  Layer *this_00;
  Point __offin;
  Point PVar7;
  Point PVar8;
  uint uVar9;
  bool change_is_noop;
  Text new_text;
  optional<Patch::Change> change;
  Point new_range_end;
  const_iterator new_text_iter;
  undefined1 local_149 [17];
  ClipResult local_138;
  Text local_128;
  Point local_f0;
  Point local_e8;
  Point local_e0;
  Point local_d8;
  Point local_d0;
  undefined1 local_c8 [32];
  Text *local_a8;
  Text *local_a0;
  pointer local_98;
  uint local_90;
  bool local_88;
  Point local_80;
  anon_class_16_2_1908bdce local_78;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_68;
  pointer local_58;
  pointer local_50;
  pointer puStack_48;
  undefined1 local_40;
  const_iterator local_38;
  
  local_e8 = old_range.end;
  local_f0 = old_range.start;
  pLVar3 = this->top_layer;
  if ((pLVar3 == this->base_layer) || (pLVar3->snapshot_count != 0)) {
    this_00 = (Layer *)operator_new(0xa0);
    Layer::Layer(this_00,pLVar3);
    this->top_layer = this_00;
  }
  local_149._1_12_ = (undefined1  [12])Layer::clip_position(this->top_layer,local_f0,true);
  bVar5 = Point::operator==(&local_e8,&local_f0);
  auVar4 = local_149._1_12_;
  if (bVar5) {
    local_138.position.row = local_149._1_4_;
    local_138.position.column = local_149._5_4_;
    local_138.offset = local_149._9_4_;
    local_149._1_12_ = auVar4;
  }
  else {
    local_138 = Layer::clip_position(this->top_layer,local_e8,true);
  }
  __offin = Point::traversal(&local_138.position,(Point *)(local_149 + 1));
  Text::Text(&local_128,string);
  PVar7 = Text::extent(&local_128);
  local_c8._0_8_ = Text::extent(&local_128);
  local_80 = Point::traverse((Point *)(local_149 + 1),(Point *)local_c8);
  uVar9 = local_138.offset - local_149._9_4_;
  local_c8._0_8_ = Point::traversal(&this->top_layer->extent_,&local_138.position);
  PVar8 = Point::traverse(&local_80,(Point *)local_c8);
  this->top_layer->extent_ = PVar8;
  uVar6 = Text::size(&local_128);
  auVar4 = local_149._1_12_;
  pLVar3 = this->top_layer;
  puVar2 = &pLVar3->size_;
  *puVar2 = *puVar2 + (uVar6 - uVar9);
  local_e0 = PVar7;
  Text::Text((Text *)local_c8);
  local_90 = local_90 & 0xffffff00;
  paVar1 = &local_128.content.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_128.content._M_dataplus._M_p == paVar1) {
    local_68._8_8_ = local_128.content.field_2._8_8_;
    local_78.change_is_noop = (bool *)&local_68;
  }
  else {
    local_78.change_is_noop = (bool *)local_128.content._M_dataplus._M_p;
  }
  local_68._M_allocated_capacity._2_6_ = local_128.content.field_2._M_allocated_capacity._2_6_;
  local_68._M_local_buf[0] = local_128.content.field_2._M_local_buf[0];
  local_78.new_text_iter = (const_iterator *)local_128.content._M_string_length;
  local_128.content._M_string_length = 0;
  local_128.content.field_2._M_local_buf[0] = L'\0';
  local_58 = local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_50 = local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  puStack_48 = local_128.line_offsets.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 1;
  local_128.content._M_dataplus._M_p = (pointer)paVar1;
  Patch::splice(&pLVar3->patch,auVar4._0_4_,(__off64_t *)__offin,local_e0.row,(__off64_t *)local_c8,
                (size_t)&local_78,uVar9);
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)puStack_48 - (long)local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78.change_is_noop != &local_68) {
    operator_delete(local_78.change_is_noop,local_68._M_allocated_capacity * 2 + 2);
  }
  if (local_a8 != (Text *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if (local_c8._0_8_ != (long)local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ * 2 + 2);
  }
  Patch::grab_change_starting_before_new_position
            ((optional<Patch::Change> *)local_c8,&this->top_layer->patch,(Point)local_149._1_8_);
  uVar9 = local_90;
  if (local_88 == true) {
    uVar6 = Text::size(local_a0);
    if (uVar9 == uVar6) {
      local_149[0] = '\x01';
      local_38 = Text::begin_abi_cxx11_(local_a0);
      local_78.new_text_iter = &local_38;
      local_78.change_is_noop = (bool *)local_149;
      Layer::
      for_each_chunk_in_range<TextBuffer::set_text_in_range(Range,std::__cxx11::u16string&&)::__0>
                (this->top_layer->previous_layer,(Point)local_c8._0_8_,(Point)local_c8._8_8_,
                 &local_78,SUB81(local_78.new_text_iter,0));
      old_splice_start = local_c8._0_8_;
      if (local_149[0] == '\x01') {
        pLVar3 = this->top_layer;
        Point::Point(&local_d0);
        Point::Point(&local_d8);
        Patch::splice_old(&pLVar3->patch,(Point)old_splice_start,local_d0,local_d8);
      }
    }
  }
  if (local_128.line_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.line_offsets.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.line_offsets.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.line_offsets.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_128.content._M_dataplus._M_p != &local_128.content.field_2) {
    operator_delete(local_128.content._M_dataplus._M_p,
                    CONCAT62(local_128.content.field_2._M_allocated_capacity._2_6_,
                             local_128.content.field_2._M_local_buf[0]) * 2 + 2);
  }
  return;
}

Assistant:

void TextBuffer::set_text_in_range(Range old_range, u16string &&string) {
  if (top_layer == base_layer || top_layer->snapshot_count > 0) {
    top_layer = new Layer(top_layer);
  }

  auto start = clip_position(old_range.start);
  auto end = old_range.end == old_range.start ? start : clip_position(old_range.end);
  Point deleted_extent = end.position.traversal(start.position);
  Text new_text{move(string)};
  Point inserted_extent = new_text.extent();
  Point new_range_end = start.position.traverse(new_text.extent());
  uint32_t deleted_text_size = end.offset - start.offset;
  top_layer->extent_ = new_range_end.traverse(top_layer->extent_.traversal(end.position));
  top_layer->size_ += new_text.size() - deleted_text_size;
  top_layer->patch.splice(
    start.position,
    deleted_extent,
    inserted_extent,
    optional<Text>{},
    move(new_text),
    deleted_text_size
  );

  auto change = top_layer->patch.grab_change_starting_before_new_position(start.position);
  if (change && change->old_text_size == change->new_text->size()) {
    bool change_is_noop = true;
    auto new_text_iter = change->new_text->begin();
    top_layer->previous_layer->for_each_chunk_in_range(
      change->old_start,
      change->old_end,
      [&change_is_noop, &new_text_iter](TextSlice chunk) {
        auto new_text_end = new_text_iter + chunk.size();
        if (!std::equal(new_text_iter, new_text_end, chunk.begin())) {
          change_is_noop = false;
          return true;
        }
        new_text_iter = new_text_end;
        return false;
      });
    if (change_is_noop) {
      top_layer->patch.splice_old(change->old_start, Point(), Point());
    }
  }
}